

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<int>::Multiply(TPZMatrix<int> *this,TPZFMatrix<int> *A,TPZFMatrix<int> *B,int opt)

{
  int64_t iVar1;
  int64_t iVar2;
  TPZFMatrix<int> *pTVar3;
  ostream *poVar4;
  int in_ECX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  size_t in_stack_000003a8;
  char *in_stack_000003b0;
  TPZFMatrix<int> *in_stack_ffffffffffffffa0;
  TPZFMatrix<int> *in_stack_ffffffffffffffa8;
  
  if (in_ECX == 0) {
    iVar1 = TPZBaseMatrix::Rows(in_RDX);
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar1 == iVar2) {
      iVar1 = TPZBaseMatrix::Cols(in_RDX);
      iVar2 = TPZBaseMatrix::Cols(in_RSI);
      if (iVar1 == iVar2) goto LAB_012ed603;
    }
    iVar1 = TPZBaseMatrix::Rows(in_RDI);
    iVar2 = TPZBaseMatrix::Cols(in_RSI);
    (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0xe])(in_RDX,iVar1,iVar2);
    goto LAB_012ed6ee;
  }
LAB_012ed603:
  if (in_ECX == 0) {
LAB_012ed692:
    if ((in_ECX != 0) && (in_RDI->fDecomposed != '\0')) {
      std::operator<<((ostream *)&std::cerr,
                      "virtual void TPZMatrix<int>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = int]"
                     );
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "\nERROR: Cannot multiply with opt when matrix is decomposed");
      std::operator<<(poVar4,"\nAborting...\n");
      pzinternal::DebugStopImpl(in_stack_000003b0,in_stack_000003a8);
    }
  }
  else {
    iVar1 = TPZBaseMatrix::Rows(in_RDX);
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar1 == iVar2) {
      in_stack_ffffffffffffffa8 = (TPZFMatrix<int> *)TPZBaseMatrix::Cols(in_RDX);
      pTVar3 = (TPZFMatrix<int> *)TPZBaseMatrix::Cols(in_RSI);
      if (in_stack_ffffffffffffffa8 == pTVar3) goto LAB_012ed692;
    }
    in_stack_ffffffffffffffa0 = (TPZFMatrix<int> *)TPZBaseMatrix::Cols(in_RDI);
    iVar1 = TPZBaseMatrix::Cols(in_RSI);
    (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0xe])(in_RDX,in_stack_ffffffffffffffa0,iVar1);
  }
LAB_012ed6ee:
  switch(in_RDI->fDecomposed) {
  case '\0':
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x27])(in_RDI,in_RSI,in_RDX,in_RDX,1,0,in_ECX);
    break;
  case '\x01':
    TPZFMatrix<int>::operator=(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x43])(in_RDI,in_RDX);
    break;
  default:
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZMatrix<int>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = int]"
                   );
    poVar4 = std::operator<<((ostream *)&std::cerr,"\nERROR: Cannot multiply with fDecomposed:");
    poVar4 = std::operator<<(poVar4,in_RDI->fDecomposed);
    std::operator<<(poVar4,"\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_000003b0,in_stack_000003a8);
    break;
  case '\x03':
    TPZFMatrix<int>::operator=(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x44])(in_RDI,in_RDX);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x45])(in_RDI,in_RDX);
    break;
  case '\x04':
    TPZFMatrix<int>::operator=(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x46])(in_RDI,in_RDX);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x48])(in_RDI,in_RDX);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x47])(in_RDI,in_RDX);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Multiply(const TPZFMatrix<TVar> &A, TPZFMatrix<TVar>&B, int opt) const {
  
	
	if(!opt && (B.Rows() != Rows() || B.Cols() != A.Cols())) {
		B.Redim(Rows(),A.Cols());
	}
	else if (opt && (B.Rows() != Cols() || B.Cols() != A.Cols())) {
		B.Redim(Cols(),A.Cols());
	}else if(opt && this->fDecomposed){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with opt when matrix is decomposed"
           <<"\nAborting...\n";
    DebugStop();
  }
  
  switch(this->fDecomposed){
  case ENoDecompose:
    MultAdd( A, B, B, 1.0, 0.0, opt);
    break;
  case ELU:
    B=A;
    Substitution(&B);
    break;
  case ECholesky:
    B=A;
    Subst_Forward(&B);
    Subst_Backward(&B);
    break;
  case ELDLt:
    B=A;
    Subst_LForward(&B);
    Subst_Diag(&B);
    Subst_LBackward(&B);
    break;
  default:
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with fDecomposed:"<<fDecomposed
           <<"\nAborting...\n";
    DebugStop();
  }
	
}